

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slab_cache.c
# Opt level: O2

void slab_cache_check(slab_cache *cache)

{
  byte order;
  rlist *prVar1;
  size_t sVar2;
  ulong uVar3;
  FILE *pFVar4;
  bool bVar5;
  size_t sVar6;
  rlist *prVar7;
  rlist *prVar8;
  intptr_t iVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  uint8_t order_00;
  uint8_t order_01;
  slab_list *psVar13;
  long local_58;
  size_t local_40;
  
  prVar1 = &(cache->allocated).slabs;
  bVar5 = true;
  local_58 = 0;
  local_40 = 0;
  sVar6 = 0;
  while( true ) {
    prVar1 = prVar1->next;
    if ((slab_list *)prVar1 == &cache->allocated) break;
    if (*(int *)&prVar1[2].next != -0x113f0012) {
      bVar5 = false;
      fprintf(_stderr,"%s: incorrect slab magic, expected %d, got %d","slab_cache_check",0xeec0ffee)
      ;
    }
    order = *(byte *)((long)&prVar1[2].next + 4);
    prVar8 = prVar1[2].prev;
    if (cache->order_max + 1 == (uint)order) {
      local_58 = (long)&prVar8->prev + local_58;
      local_40 = (long)&prVar8->prev + local_40;
    }
    else {
      prVar7 = (rlist *)slab_order_size(cache,order);
      pFVar4 = _stderr;
      if (prVar8 != prVar7) {
        iVar9 = slab_order_size(cache,*(uint8_t *)((long)&prVar1[2].next + 4));
        bVar5 = false;
        fprintf(pFVar4,"%s: incorrect slab size, expected %zu, got %zu","slab_cache_check",iVar9,
                prVar1[2].prev);
      }
      prVar8 = (rlist *)slab_order_size(cache,cache->order_max);
    }
    sVar6 = (long)&prVar8->prev + sVar6;
  }
  sVar2 = (cache->allocated).stats.total;
  if (sVar6 != sVar2) {
    bVar5 = false;
    fprintf(_stderr,"%s: incorrect slab statistics, total %zu, factual %zu\n","slab_cache_check",
            sVar2,sVar6);
  }
  order_00 = '\0';
  lVar12 = 0;
  for (psVar13 = cache->orders; psVar13 <= cache->orders + cache->order_max; psVar13 = psVar13 + 1)
  {
    iVar9 = slab_order_size(cache,order_00);
    uVar3 = (psVar13->stats).total;
    local_40 = local_40 + (psVar13->stats).used;
    order_01 = (uint8_t)iVar9;
    uVar10 = slab_order_size(cache,order_01);
    pFVar4 = _stderr;
    if (uVar3 % uVar10 != 0) {
      sVar2 = (psVar13->stats).total;
      iVar9 = slab_order_size(cache,order_01);
      bVar5 = false;
      fprintf(pFVar4,
              "%s: incorrect order statistics, the total %zu is not multiple of slab size %zu\n",
              "slab_cache_check",sVar2,iVar9);
    }
    uVar10 = (psVar13->stats).used;
    uVar11 = slab_order_size(cache,order_01);
    pFVar4 = _stderr;
    if (uVar10 % uVar11 != 0) {
      sVar2 = (psVar13->stats).used;
      iVar9 = slab_order_size(cache,order_01);
      bVar5 = false;
      fprintf(pFVar4,
              "%s: incorrect order statistics, the used %zu is not multiple of slab size %zu\n",
              "slab_cache_check",sVar2,iVar9);
    }
    lVar12 = lVar12 + uVar3;
    order_00 = order_00 + '\x01';
  }
  if (lVar12 + local_58 == sVar6) {
    sVar6 = (cache->allocated).stats.used;
    if (local_40 == sVar6) {
      if (bVar5) {
        return;
      }
      goto LAB_00105a7b;
    }
  }
  else {
    fprintf(_stderr,"%s: incorrect totals, ordered %zu,  huge %zu, total %zu\n","slab_cache_check");
    sVar6 = (cache->allocated).stats.used;
    if (local_40 == sVar6) goto LAB_00105a7b;
  }
  fprintf(_stderr,"%s: incorrect used total, total %zu, sum %zu\n","slab_cache_check",sVar6,local_40
         );
LAB_00105a7b:
  abort();
}

Assistant:

void
slab_cache_check(struct slab_cache *cache)
{
	size_t total = 0;
	size_t used = 0;
	size_t ordered = 0;
	size_t huge = 0;
	bool dont_panic = true;

	struct rlist *slabs = &cache->allocated.slabs;
	struct slab *slab;

	rlist_foreach_entry(slab, slabs, next_in_cache) {
		if (slab->magic != slab_magic) {
			fprintf(stderr, "%s: incorrect slab magic,"
				" expected %d, got %d", __func__,
				slab_magic, slab->magic);
			dont_panic = false;
		}
		if (slab->order == cache->order_max + 1) {
			huge += slab->size;
			used += slab->size;
			total += slab->size;
		} else {
			if ((intptr_t) slab->size !=
					slab_order_size(cache, slab->order)) {
				fprintf(stderr, "%s: incorrect slab size,"
					" expected %zu, got %zu", __func__,
					slab_order_size(cache, slab->order),
					slab->size);
				dont_panic = false;
			}
			/*
			 * The slab may have been reformatted
			 * and split into smaller slabs, don't
			 * trust slab->size.
			 */
			total += slab_order_size(cache, cache->order_max);
		}
	}

	if (total != cache->allocated.stats.total) {
		fprintf(stderr, "%s: incorrect slab statistics, total %zu,"
			" factual %zu\n", __func__,
			cache->allocated.stats.total,
			total);
		dont_panic = false;
	}
	struct slab_list *list;
	for (list = cache->orders;
	     list <= cache->orders + cache->order_max;
	     list++) {

		uint8_t order = slab_order_size(cache, list - cache->orders);
		ordered += list->stats.total;
		used += list->stats.used;

		if (list->stats.total % slab_order_size(cache, order)) {
			fprintf(stderr, "%s: incorrect order statistics, the"
				" total %zu is not multiple of slab size %zu\n",
				__func__, list->stats.total,
				slab_order_size(cache, order));
			dont_panic = false;
		}
		if (list->stats.used % slab_order_size(cache, order)) {
			fprintf(stderr, "%s: incorrect order statistics, the"
				" used %zu is not multiple of slab size %zu\n",
				__func__, list->stats.used,
				slab_order_size(cache, order));
			dont_panic = false;
		}
	}

	if (ordered + huge != total) {
		fprintf(stderr, "%s: incorrect totals, ordered %zu, "
			" huge %zu, total %zu\n", __func__,
			ordered, huge, total);
		dont_panic = false;
	}
	if (used != cache->allocated.stats.used) {
		fprintf(stderr, "%s: incorrect used total, "
			"total %zu, sum %zu\n", __func__,
			cache->allocated.stats.used,
			used);
		dont_panic = false;
	}
	if (dont_panic)
		return;
	abort();
}